

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_creader_unpause(Curl_easy *data)

{
  Curl_creader *pCVar1;
  CURLcode CVar2;
  Curl_creader **ppCVar3;
  
  ppCVar3 = &(data->req).reader_stack;
  do {
    pCVar1 = *ppCVar3;
    if (pCVar1 == (Curl_creader *)0x0) {
      return CURLE_OK;
    }
    CVar2 = (*pCVar1->crt->unpause)(data,pCVar1);
    ppCVar3 = &pCVar1->next;
  } while (CVar2 == CURLE_OK);
  return CVar2;
}

Assistant:

CURLcode Curl_creader_unpause(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;
  CURLcode result = CURLE_OK;

  while(reader) {
    result = reader->crt->unpause(data, reader);
    if(result)
      break;
    reader = reader->next;
  }
  return result;
}